

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O0

function<void_()> * __thiscall
Console::bindCallback<std::__cxx11::string>
          (function<void_()> *__return_storage_ptr__,Console *this,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,int argumentIndex)

{
  const_reference s;
  function<void_()> local_d8;
  anon_class_64_2_4fe94ccd local_a8;
  undefined1 local_68 [8];
  function<void_()> nextCallback;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  int argumentIndex_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *callback_local;
  
  s = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)callback,(long)(int)arguments);
  argumentConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::convert((argumentConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&nextCallback._M_invoker,s);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(&local_a8.callback,
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)this);
  std::__cxx11::string::string((string *)&local_a8.value,(string *)&nextCallback._M_invoker);
  std::function<void()>::
  function<Console::bindCallback<std::__cxx11::string>(std::function<void(std::__cxx11::string)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)::_lambda()_1_,void>
            ((function<void()> *)local_68,&local_a8);
  bindCallback<std::__cxx11::string>(std::function<void(std::__cxx11::string)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)
  ::{lambda()#1}::~vector((_lambda___1_ *)&local_a8);
  std::function<void_()>::function(&local_d8,(function<void_()> *)local_68);
  bindCallback(__return_storage_ptr__,&local_d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)callback,(int)arguments + 1);
  std::function<void_()>::~function(&local_d8);
  std::function<void_()>::~function((function<void_()> *)local_68);
  std::__cxx11::string::~string((string *)&nextCallback._M_invoker);
  return __return_storage_ptr__;
}

Assistant:

std::function<void()> Console::bindCallback(std::function<void(T, Args...)> callback, const std::vector<std::string> &arguments, int argumentIndex)
{
    T value = argumentConverter<T>::convert(arguments.at(argumentIndex));
    std::function<void(Args...)> nextCallback = [callback, value](Args... args) {
        callback(value, args...);
    };
    return bindCallback(nextCallback, arguments, argumentIndex + 1);
}